

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edges_iterators.cc
# Opt level: O0

range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t,_tchecker::end_iterator_t> *
tchecker::syncprod::outgoing_synchronized_edges
          (range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t,_tchecker::end_iterator_t>
           *__return_storage_ptr__,system_t *system,
          intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
          *vloc)

{
  end_iterator_t *end;
  __normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>
  *sync_end;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  vloc_synchronized_edges_iterator_t begin;
  range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
  syncs;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
  *vloc_local;
  system_t *system_local;
  
  join_0x00000010_0x00000000_ =
       tchecker::system::synchronizations_t::synchronizations
                 (&(system->super_system_t).super_synchronizations_t);
  tchecker::system::edges_t::outgoing_edges_maps((edges_t *)local_b8);
  end = (end_iterator_t *)
        range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
        ::begin((range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
                 *)&begin._cartesian_it._its.
                    super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  sync_end = range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
             ::end((range_t<__gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>,___gnu_cxx::__normal_iterator<const_tchecker::system::synchronization_t_*,_std::vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>_>_>
                    *)&begin._cartesian_it._its.
                       super__Vector_base<tchecker::system::edges_collection_const_iterator_t,_std::allocator<tchecker::system::edges_collection_const_iterator_t>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  vloc_synchronized_edges_iterator_t::vloc_synchronized_edges_iterator_t
            ((vloc_synchronized_edges_iterator_t *)local_a8,vloc,
             (shared_ptr<const_tchecker::system::loc_edges_maps_t> *)local_b8,
             (const_iterator_t *)end,sync_end);
  std::shared_ptr<const_tchecker::system::loc_edges_maps_t>::~shared_ptr
            ((shared_ptr<const_tchecker::system::loc_edges_maps_t> *)local_b8);
  make_range<tchecker::syncprod::vloc_synchronized_edges_iterator_t,tchecker::end_iterator_t>
            (__return_storage_ptr__,(tchecker *)local_a8,
             (vloc_synchronized_edges_iterator_t *)&past_the_end_iterator,end);
  vloc_synchronized_edges_iterator_t::~vloc_synchronized_edges_iterator_t
            ((vloc_synchronized_edges_iterator_t *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

tchecker::range_t<tchecker::syncprod::vloc_synchronized_edges_iterator_t, tchecker::end_iterator_t>
outgoing_synchronized_edges(tchecker::syncprod::system_t const & system,
                            tchecker::intrusive_shared_ptr_t<tchecker::shared_vloc_t const> const & vloc)
{
  auto syncs = system.synchronizations();
  tchecker::syncprod::vloc_synchronized_edges_iterator_t begin(vloc, system.outgoing_edges_maps(), syncs.begin(), syncs.end());

  return tchecker::make_range(begin, tchecker::past_the_end_iterator);
}